

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

logical pnga_allocate(Integer g_a)

{
  short sVar1;
  short sVar2;
  bool bVar3;
  int iVar4;
  C_Integer *pCVar5;
  Integer IVar6;
  logical lVar7;
  long in_RDI;
  Integer me_local;
  Integer _ndim_7;
  Integer _i_7;
  Integer _itmp_4;
  Integer offset;
  Integer index_2 [7];
  Integer tot_2;
  Integer imax_2;
  Integer imin_2;
  Integer skip_2;
  Integer jtot_2;
  Integer j_3;
  Integer _ndim_6;
  Integer _i_6;
  Integer _itmp_3;
  Integer index_1 [7];
  Integer tot_1;
  Integer imax_1;
  Integer imin_1;
  Integer skip_1;
  Integer jtot_1;
  Integer j_2;
  Integer _ndim_5;
  Integer _i_5;
  Integer _itmp_2;
  Integer index [7];
  Integer tot;
  Integer imax;
  Integer imin;
  Integer skip;
  Integer jtot;
  Integer j_1;
  int _ndim_4;
  int _i_4;
  int _itmp_1;
  int _offset;
  int _ndim_3;
  int _i_3;
  int _index_3 [7];
  int _ndim_2;
  int _i_2;
  int _itmp;
  int _ndim_1;
  int _i_1;
  int _index_2 [7];
  int _ndim;
  int _i;
  Integer _dimpos_1;
  Integer _dimstart_1;
  Integer _dim_1;
  Integer _index_1;
  Integer _d_1;
  Integer _nb_1;
  Integer _loc_1;
  Integer _dimpos;
  Integer _dimstart;
  Integer _dim;
  Integer _index;
  Integer _d;
  Integer _nb;
  Integer _loc;
  Integer lo [7];
  Integer j;
  Integer tsize;
  Integer nblocks;
  Integer b;
  Integer ddim;
  int p;
  Integer pcut;
  Integer nblock;
  Integer block_size;
  Integer grp_nproc;
  Integer grp_me;
  Integer blk [7];
  Integer *map;
  Integer *pmap [7];
  Integer pe [7];
  Integer chunk [7];
  Integer dims [7];
  Integer p_handle;
  Integer maplen;
  Integer status;
  Integer i;
  Integer pnum;
  Integer nelem;
  Integer mem_size;
  Integer ndim;
  Integer width [7];
  Integer d;
  Integer ga_handle;
  Integer hi [7];
  int in_stack_fffffffffffffa88;
  int in_stack_fffffffffffffa8c;
  char *in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa98;
  int in_stack_fffffffffffffa9c;
  void *in_stack_fffffffffffffaa0;
  char **in_stack_fffffffffffffaa8;
  char *in_stack_fffffffffffffab0;
  long local_548;
  long local_538;
  long in_stack_fffffffffffffad0;
  int grp_id;
  long *in_stack_fffffffffffffad8;
  undefined8 in_stack_fffffffffffffae0;
  long in_stack_fffffffffffffae8;
  char **in_stack_fffffffffffffaf0;
  char *in_stack_fffffffffffffaf8;
  Integer *in_stack_fffffffffffffb00;
  long lVar8;
  Integer *in_stack_fffffffffffffb08;
  int in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  char *in_stack_fffffffffffffb18;
  Integer in_stack_fffffffffffffb20;
  Integer *in_stack_fffffffffffffb28;
  Integer in_stack_fffffffffffffb30;
  long local_4c0;
  long local_4b8;
  long local_4a0;
  long local_498;
  long local_488;
  Integer local_480;
  long local_478 [7];
  long local_440;
  long local_438;
  long local_430;
  long local_428;
  long local_420;
  long local_418;
  long local_410;
  long local_408;
  Integer local_400;
  long local_3f8 [4];
  Integer in_stack_fffffffffffffc28;
  char *in_stack_fffffffffffffc30;
  long local_3c0;
  long local_3b8;
  long local_3a0;
  long local_398;
  int local_38c;
  int local_388;
  int local_384;
  int local_37c;
  int local_378 [7];
  int local_35c;
  int local_358;
  int local_354;
  int local_350;
  int local_34c;
  int local_348 [10];
  int local_320;
  int local_31c;
  long local_318;
  long local_310;
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  C_Integer aCStack_2a8 [7];
  long local_270;
  Integer *in_stack_fffffffffffffd98;
  Integer *in_stack_fffffffffffffda0;
  long in_stack_fffffffffffffda8;
  long in_stack_fffffffffffffdb0;
  int local_244;
  long local_240;
  char *local_238;
  long local_230;
  Integer local_220;
  long local_218 [7];
  Integer *local_1e0;
  undefined8 auStack_1d8 [8];
  long local_198 [8];
  long local_158 [8];
  C_Integer local_118 [8];
  char **local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  Integer local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  C_Integer aCStack_98 [8];
  long local_58;
  long local_50;
  C_Integer local_48 [9];
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffae0 >> 0x20);
  local_50 = in_RDI + 1000;
  local_d0 = 0;
  local_220 = GAme;
  local_230 = 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  local_238 = in_stack_fffffffffffffab0;
  if (GA[local_50].ndim == -1) {
    pnga_error(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    local_238 = in_stack_fffffffffffffab0;
  }
  local_d8 = (char **)(long)GA[local_50].p_handle;
  if (local_d8 == (char **)(long)GA_Init_Proc_Group) {
    GA[local_50].p_handle = GA_Default_Proc_Group;
    local_d8 = (char **)(long)GA_Default_Proc_Group;
  }
  pnga_pgroup_sync((Integer)in_stack_fffffffffffffa90);
  if (0 < (long)local_d8) {
    local_220 = (Integer)PGRP_LIST[(long)local_d8].map_proc_list[GAme];
  }
  if (GAinitialized == 0) {
    pnga_error(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  }
  if (ma_address_init == 0) {
    gai_ma_address_init();
  }
  grp_id = (int)((ulong)in_stack_fffffffffffffad0 >> 0x20);
  sVar1 = GA[local_50].ndim;
  local_a0 = (long)sVar1;
  for (local_c0 = 0; local_c0 < sVar1; local_c0 = local_c0 + 1) {
    aCStack_98[local_c0] = GA[local_50].width[local_c0];
  }
  if ((GA[local_50].mapc == (C_Integer *)0x0) && (GA[local_50].distr_type == 0)) {
    for (local_58 = 0; local_58 < local_a0; local_58 = local_58 + 1) {
      local_118[local_58] = GA[local_50].dims[local_58];
      local_158[local_58] = GA[local_50].chunk[local_58];
    }
    if (local_158[0] == 0) {
      for (local_58 = 0; local_58 < local_a0; local_58 = local_58 + 1) {
        local_218[local_58] = -1;
      }
    }
    else {
      for (local_58 = 0; local_58 < local_a0; local_58 = local_58 + 1) {
        if (local_118[local_58] < local_158[local_58]) {
          in_stack_fffffffffffffad8 = (long *)local_118[local_58];
        }
        else {
          in_stack_fffffffffffffad8 = (long *)local_158[local_58];
        }
        local_218[local_58] = (long)in_stack_fffffffffffffad8;
      }
    }
    for (local_58 = 0; local_58 < local_a0; local_58 = local_58 + 1) {
      if (local_118[local_58] == 1) {
        local_218[local_58] = 1;
      }
    }
    pnga_pgroup_sync((Integer)in_stack_fffffffffffffa90);
    if (local_d8 == (char **)0x0) {
      ddb_h2(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
             (double)in_stack_fffffffffffffb18,
             CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),in_stack_fffffffffffffb08
             ,in_stack_fffffffffffffb00);
    }
    else if (GA[local_50].num_rstrctd == 0) {
      ddb_h2(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
             (double)in_stack_fffffffffffffb18,
             CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),in_stack_fffffffffffffb08
             ,in_stack_fffffffffffffb00);
    }
    else {
      ddb_h2(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
             (double)in_stack_fffffffffffffb18,
             CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),in_stack_fffffffffffffb08
             ,in_stack_fffffffffffffb00);
    }
    local_1e0 = mapALL;
    for (local_58 = 0; grp_id = (int)((ulong)in_stack_fffffffffffffad0 >> 0x20), local_58 < local_a0
        ; local_58 = local_58 + 1) {
      auStack_1d8[local_58] = local_1e0;
      if (local_158[local_58] < 2) {
        local_240 = local_118[local_58] - (local_218[local_58] + -1) * local_198[local_58];
      }
      else {
        in_stack_fffffffffffffad0 = local_118[local_58] + -1;
        if (local_118[local_58] < local_158[local_58]) {
          local_538 = local_118[local_58];
        }
        else {
          local_538 = local_158[local_58];
        }
        in_stack_fffffffffffffdb0 = in_stack_fffffffffffffad0 / local_538 + 1;
        local_240 = in_stack_fffffffffffffdb0 - (local_218[local_58] + -1) * local_198[local_58];
      }
      local_244 = 0;
      local_c0 = 0;
      local_238 = (char *)0x0;
      while( true ) {
        bVar3 = false;
        if ((long)local_244 < local_198[local_58]) {
          bVar3 = local_c0 < local_118[local_58];
        }
        if (!bVar3) break;
        in_stack_fffffffffffffda8 = local_218[local_58];
        if (local_240 <= local_244) {
          in_stack_fffffffffffffda8 = in_stack_fffffffffffffda8 + -1;
        }
        local_1e0[(long)local_238] = local_c0 + 1;
        if (1 < local_158[local_58]) {
          if (local_118[local_58] < local_158[local_58]) {
            local_548 = local_118[local_58];
          }
          else {
            local_548 = local_158[local_58];
          }
          in_stack_fffffffffffffda8 = local_548 * in_stack_fffffffffffffda8;
        }
        local_c0 = in_stack_fffffffffffffda8 + local_c0;
        local_244 = local_244 + 1;
        local_238 = local_238 + 1;
      }
      if (local_198[local_58] <= (long)local_238) {
        local_238 = (char *)local_198[local_58];
      }
      local_198[local_58] = (long)local_238;
      local_1e0 = local_1e0 + local_198[local_58];
    }
    local_d0 = 0;
    for (local_c0 = 0; local_c0 < local_a0; local_c0 = local_c0 + 1) {
      GA[local_50].nblock[local_c0] = (int)local_198[local_c0];
      local_d0 = local_198[local_c0] + local_d0;
    }
    pCVar5 = (C_Integer *)malloc((local_d0 + 1) * 8);
    GA[local_50].mapc = pCVar5;
    for (local_c0 = 0; local_c0 < local_d0; local_c0 = local_c0 + 1) {
      GA[local_50].mapc[local_c0] = mapALL[local_c0];
    }
    GA[local_50].mapc[local_d0] = -1;
  }
  else if (GA[local_50].distr_type == 1) {
    in_stack_fffffffffffffda0 = (Integer *)GA[local_50].block_total;
    local_230 = 0;
    for (local_c0 = GAme; local_c0 < (long)in_stack_fffffffffffffda0; local_c0 = GAnproc + local_c0)
    {
      if (GA[local_50].distr_type == 0) {
        if (GA[local_50].num_rstrctd == 0) {
          local_2d0 = (long)GA[local_50].ndim;
          local_2d8 = 0;
          local_2b8 = 1;
          for (local_2c0 = 0; local_2c0 < local_2d0; local_2c0 = local_2c0 + 1) {
            local_2b8 = GA[local_50].nblock[local_2c0] * local_2b8;
          }
          if ((local_2b8 + -1 < local_c0) || (local_c0 < 0)) {
            for (local_2c0 = 0; local_2c0 < local_2d0; local_2c0 = local_2c0 + 1) {
              aCStack_2a8[local_2c0] = 0;
              local_48[local_2c0] = -1;
            }
          }
          else {
            local_2c8 = local_c0;
            for (local_2c0 = 0; local_2c0 < local_2d0; local_2c0 = local_2c0 + 1) {
              local_2b0 = local_2c8 % (long)GA[local_50].nblock[local_2c0];
              local_2c8 = local_2c8 / (long)GA[local_50].nblock[local_2c0];
              local_2e0 = local_2b0 + local_2d8;
              local_2d8 = GA[local_50].nblock[local_2c0] + local_2d8;
              aCStack_2a8[local_2c0] = GA[local_50].mapc[local_2e0];
              if (local_2b0 == GA[local_50].nblock[local_2c0] + -1) {
                local_48[local_2c0] = GA[local_50].dims[local_2c0];
              }
              else {
                local_48[local_2c0] = GA[local_50].mapc[local_2e0 + 1] + -1;
              }
            }
          }
        }
        else if (local_c0 < GA[local_50].num_rstrctd) {
          local_308 = (long)GA[local_50].ndim;
          local_310 = 0;
          local_2f0 = 1;
          for (local_2f8 = 0; local_2f8 < local_308; local_2f8 = local_2f8 + 1) {
            local_2f0 = GA[local_50].nblock[local_2f8] * local_2f0;
          }
          if ((local_2f0 + -1 < local_c0) || (local_c0 < 0)) {
            for (local_2f8 = 0; local_2f8 < local_308; local_2f8 = local_2f8 + 1) {
              aCStack_2a8[local_2f8] = 0;
              local_48[local_2f8] = -1;
            }
          }
          else {
            local_300 = local_c0;
            for (local_2f8 = 0; local_2f8 < local_308; local_2f8 = local_2f8 + 1) {
              local_2e8 = local_300 % (long)GA[local_50].nblock[local_2f8];
              local_300 = local_300 / (long)GA[local_50].nblock[local_2f8];
              local_318 = local_2e8 + local_310;
              local_310 = GA[local_50].nblock[local_2f8] + local_310;
              aCStack_2a8[local_2f8] = GA[local_50].mapc[local_318];
              if (local_2e8 == GA[local_50].nblock[local_2f8] + -1) {
                local_48[local_2f8] = GA[local_50].dims[local_2f8];
              }
              else {
                local_48[local_2f8] = GA[local_50].mapc[local_318 + 1] + -1;
              }
            }
          }
        }
        else {
          sVar1 = GA[local_50].ndim;
          local_320 = (int)sVar1;
          for (local_31c = 0; local_31c < sVar1; local_31c = local_31c + 1) {
            aCStack_2a8[local_31c] = 0;
            local_48[local_31c] = -1;
          }
        }
      }
      else {
        local_388 = (int)local_c0;
        if (((GA[local_50].distr_type == 1) || (GA[local_50].distr_type == 2)) ||
           (GA[local_50].distr_type == 3)) {
          sVar1 = GA[local_50].ndim;
          local_350 = (int)sVar1;
          sVar2 = GA[local_50].ndim;
          local_35c = (int)sVar2;
          local_354 = local_388;
          local_348[0] = (int)((long)local_388 % GA[local_50].num_blocks[0]);
          for (local_358 = 1; local_358 < sVar2; local_358 = local_358 + 1) {
            local_354 = (int)((long)(local_354 - local_348[local_358 + -1]) /
                             GA[local_50].num_blocks[local_358 + -1]);
            local_348[local_358] = (int)((long)local_354 % GA[local_50].num_blocks[local_358]);
          }
          for (local_34c = 0; local_34c < sVar1; local_34c = local_34c + 1) {
            aCStack_2a8[local_34c] =
                 (long)local_348[local_34c] * GA[local_50].block_dims[local_34c] + 1;
            local_48[local_34c] =
                 (long)(local_348[local_34c] + 1) * GA[local_50].block_dims[local_34c];
            if (GA[local_50].dims[local_34c] < local_48[local_34c]) {
              local_48[local_34c] = GA[local_50].dims[local_34c];
            }
          }
        }
        else if (GA[local_50].distr_type == 4) {
          sVar1 = GA[local_50].ndim;
          local_384 = 0;
          sVar2 = GA[local_50].ndim;
          local_378[0] = (int)((long)local_388 % GA[local_50].num_blocks[0]);
          for (local_38c = 1; local_38c < sVar2; local_38c = local_38c + 1) {
            local_388 = (int)((long)(local_388 - local_378[local_38c + -1]) /
                             GA[local_50].num_blocks[local_38c + -1]);
            local_378[local_38c] = (int)((long)local_388 % GA[local_50].num_blocks[local_38c]);
          }
          for (local_37c = 0; local_37c < sVar1; local_37c = local_37c + 1) {
            aCStack_2a8[local_37c] = GA[local_50].mapc[local_384 + local_378[local_37c]];
            if ((long)local_378[local_37c] < GA[local_50].num_blocks[local_37c] + -1) {
              local_48[local_37c] = GA[local_50].mapc[local_384 + local_378[local_37c] + 1] + -1;
            }
            else {
              local_48[local_37c] = GA[local_50].dims[local_37c];
            }
            local_384 = local_384 + (int)GA[local_50].num_blocks[local_37c];
          }
        }
      }
      in_stack_fffffffffffffd98 = (Integer *)0x1;
      for (local_270 = 0; local_270 < local_a0; local_270 = local_270 + 1) {
        in_stack_fffffffffffffd98 =
             (Integer *)
             (((local_48[local_270] - aCStack_2a8[local_270]) + 1) * (long)in_stack_fffffffffffffd98
             );
      }
      local_230 = (long)in_stack_fffffffffffffd98 + local_230;
    }
  }
  else if (GA[local_50].distr_type == 2) {
    sVar1 = GA[local_50].ndim;
    local_410 = (long)sVar1;
    local_400 = GAme;
    local_3f8[0] = GAme % (long)GA[local_50].nblock[0];
    for (local_408 = 1; local_408 < sVar1; local_408 = local_408 + 1) {
      local_400 = (local_400 - local_3f8[local_408 + -1]) /
                  (long)GA[local_50].nblock[local_408 + -1];
      local_3f8[local_408] = local_400 % (long)GA[local_50].nblock[local_408];
    }
    local_230 = 1;
    local_3c0 = 1;
    for (local_c0 = 0; local_c0 < GA[local_50].ndim; local_c0 = local_c0 + 1) {
      local_3c0 = GA[local_50].nblock[local_c0] * local_3c0;
    }
    if (GA[local_50].num_rstrctd == 0) {
      local_b8 = pnga_pgroup_nnodes((long)GA[local_50].p_handle);
    }
    else {
      local_b8 = GA[local_50].num_rstrctd;
    }
    if (local_3c0 != local_b8) {
      pnga_error(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    }
    for (local_c0 = 0; local_c0 < local_a0; local_c0 = local_c0 + 1) {
      local_3a0 = 0;
      for (local_398 = local_3f8[local_c0]; local_398 < GA[local_50].num_blocks[local_c0];
          local_398 = GA[local_50].nblock[local_c0] + local_398) {
        local_3b8 = (local_398 + 1) * GA[local_50].block_dims[local_c0];
        if (GA[local_50].dims[local_c0] < local_3b8) {
          local_3b8 = GA[local_50].dims[local_c0];
        }
        local_3a0 = (local_3b8 - (local_398 * GA[local_50].block_dims[local_c0] + 1)) + 1 +
                    local_3a0;
      }
      local_230 = local_3a0 * local_230;
    }
  }
  else if (GA[local_50].distr_type == 3) {
    sVar1 = GA[local_50].ndim;
    local_480 = GAme;
    local_478[0] = GAme % (long)GA[local_50].nblock[0];
    for (local_488 = 1; local_488 < sVar1; local_488 = local_488 + 1) {
      local_480 = (local_480 - local_478[local_488 + -1]) /
                  (long)GA[local_50].nblock[local_488 + -1];
      local_478[local_488] = local_480 % (long)GA[local_50].nblock[local_488];
    }
    local_230 = 1;
    local_440 = 1;
    for (local_c0 = 0; local_c0 < GA[local_50].ndim; local_c0 = local_c0 + 1) {
      local_440 = GA[local_50].nblock[local_c0] * local_440;
    }
    if (GA[local_50].num_rstrctd == 0) {
      local_b8 = pnga_pgroup_nnodes((long)GA[local_50].p_handle);
    }
    else {
      local_b8 = GA[local_50].num_rstrctd;
    }
    if (local_440 != local_b8) {
      pnga_error(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    }
    for (local_c0 = 0; local_c0 < local_a0; local_c0 = local_c0 + 1) {
      local_428 = (long)GA[local_50].nblock[local_c0];
      local_420 = 0;
      for (local_418 = local_478[local_c0]; local_418 < GA[local_50].num_blocks[local_c0];
          local_418 = GA[local_50].nblock[local_c0] + local_418) {
        local_430 = local_418 * GA[local_50].block_dims[local_c0] + 1;
        local_438 = (local_418 + 1) * GA[local_50].block_dims[local_c0];
        if (GA[local_50].dims[local_c0] < local_438) {
          local_438 = GA[local_50].dims[local_c0];
        }
        local_420 = (local_438 - local_430) + 1 + local_420;
      }
      local_230 = local_420 * local_230;
    }
  }
  else if (GA[local_50].distr_type == 4) {
    lVar8 = 0;
    in_stack_fffffffffffffae8 = (long)GA[local_50].ndim;
    in_stack_fffffffffffffaf8 = (char *)GAme;
    for (in_stack_fffffffffffffaf0 = (char **)0x1;
        (long)in_stack_fffffffffffffaf0 < in_stack_fffffffffffffae8;
        in_stack_fffffffffffffaf0 = (char **)((long)in_stack_fffffffffffffaf0 + 1)) {
      in_stack_fffffffffffffaf8 =
           (char *)(((long)in_stack_fffffffffffffaf8 -
                    *(long *)(&stack0xfffffffffffffb08 + ((long)in_stack_fffffffffffffaf0 + -1) * 8)
                    ) / (long)GA[local_50].nblock[(long)in_stack_fffffffffffffaf0 + -1]);
      *(long *)(&stack0xfffffffffffffb08 + (long)in_stack_fffffffffffffaf0 * 8) =
           (long)in_stack_fffffffffffffaf8 %
           (long)GA[local_50].nblock[(long)in_stack_fffffffffffffaf0];
    }
    local_230 = 1;
    local_4c0 = 1;
    for (local_c0 = 0; local_c0 < GA[local_50].ndim; local_c0 = local_c0 + 1) {
      local_4c0 = GA[local_50].nblock[local_c0] * local_4c0;
    }
    if (GA[local_50].num_rstrctd == 0) {
      local_b8 = pnga_pgroup_nnodes((long)GA[local_50].p_handle);
    }
    else {
      local_b8 = GA[local_50].num_rstrctd;
    }
    if (local_4c0 != local_b8) {
      pnga_error(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    }
    for (local_c0 = 0; local_c0 < local_a0; local_c0 = local_c0 + 1) {
      local_4a0 = 0;
      for (local_498 = *(long *)(&stack0xfffffffffffffb08 + local_c0 * 8);
          local_498 < GA[local_50].num_blocks[local_c0];
          local_498 = GA[local_50].nblock[local_c0] + local_498) {
        if (local_498 < GA[local_50].num_blocks[local_c0] + -1) {
          local_4b8 = GA[local_50].mapc[lVar8 + local_498 + 1] + -1;
        }
        else {
          local_4b8 = GA[local_50].dims[local_c0];
        }
        local_4a0 = (local_4b8 - GA[local_50].mapc[lVar8 + local_498]) + 1 + local_4a0;
      }
      local_230 = local_4a0 * local_230;
      lVar8 = GA[local_50].num_blocks[local_c0] + lVar8;
    }
  }
  GAstat.numcre = GAstat.numcre + 1;
  GA[local_50].actv = 1;
  IVar6 = pnga_cluster_nnodes();
  if ((IVar6 == 1) && (GA[local_50].p_handle == 0)) {
    IVar6 = pnga_pgroup_get_world();
    GA[local_50].p_handle = (int)IVar6;
  }
  if (GA[local_50].distr_type == 0) {
    for (local_c0 = 0; local_c0 < local_a0; local_c0 = local_c0 + 1) {
      GA[local_50].scale[local_c0] =
           (double)GA[local_50].nblock[local_c0] / (double)GA[local_50].dims[local_c0];
    }
    pnga_set_ghost_corner_flag
              ((Integer)in_stack_fffffffffffffa90,
               CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    if (local_d8 == (char **)0x0) {
      iVar4 = PGRP_LIST->map_proc_list[GAme] >> 0x1f;
      pnga_distribution(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                        in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    }
    else {
      pnga_distribution(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                        in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    }
    if ((GA[local_50].num_rstrctd == 0) || (GA[local_50].has_data == 1)) {
      local_b0 = 1;
      for (local_c0 = 0; local_c0 < local_a0; local_c0 = local_c0 + 1) {
        local_b0 = ((local_48[local_c0] - GA[local_50].lo[local_c0]) + 1 + aCStack_98[local_c0] * 2)
                   * local_b0;
      }
    }
    else {
      local_b0 = 0;
    }
    local_a8 = local_b0 * GA[local_50].elemsize;
  }
  else {
    local_a8 = local_230 * GA[local_50].elemsize;
    for (local_c0 = 0; local_c0 < local_a0; local_c0 = local_c0 + 1) {
      GA[local_50].scale[local_c0] =
           (double)GA[local_50].num_blocks[local_c0] / (double)GA[local_50].dims[local_c0];
    }
  }
  GA[local_50].id = -1;
  GA[local_50].size = local_a8;
  if (GA_memory_limited == 0) {
    local_c8 = 1;
  }
  else {
    GA_total_memory = GA_total_memory - local_a8;
    local_c8 = (long)(int)(uint)(-1 < GA_total_memory);
    if ((long)local_d8 < 1) {
      pnga_type_f2c(0x3f2);
      pnga_gop((Integer)local_238,in_stack_fffffffffffffaa8,(Integer)in_stack_fffffffffffffaa0,
               (char *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
    }
    else {
      in_stack_fffffffffffffaa8 = local_d8;
      pnga_type_f2c(0x3f2);
      pnga_pgroup_gop((Integer)local_238,(Integer)in_stack_fffffffffffffaa8,
                      in_stack_fffffffffffffaa0,
                      CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
                      in_stack_fffffffffffffa90);
    }
  }
  if (local_c8 == 0) {
    GA[local_50].ptr[local_220] = (char *)0x0;
  }
  else {
    if (GA[local_50].mem_dev_set == 0) {
      iVar4 = gai_getmem(local_238,in_stack_fffffffffffffaa8,(C_Long)in_stack_fffffffffffffaa0,
                         in_stack_fffffffffffffa9c,(long *)in_stack_fffffffffffffa90,
                         in_stack_fffffffffffffa8c);
    }
    else {
      in_stack_fffffffffffffa88 = GA[local_50].mem_dev_set;
      in_stack_fffffffffffffa90 = GA[local_50].mem_dev;
      iVar4 = gai_get_devmem(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,
                             in_stack_fffffffffffffae8,iVar4,in_stack_fffffffffffffad8,grp_id,
                             in_stack_fffffffffffffb10,in_stack_fffffffffffffb18);
    }
    local_c8 = (long)(int)(uint)((iVar4 != 0 ^ 0xffU) & 1);
  }
  if (((GA[local_50].distr_type == 0) && (GA[local_50].ghosts == 1)) &&
     (lVar7 = pnga_set_ghost_info(CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88)),
     lVar7 == 0)) {
    pnga_error(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  }
  pnga_pgroup_sync((Integer)in_stack_fffffffffffffa90);
  if (local_c8 == 0) {
    if (GA_memory_limited != 0) {
      GA_total_memory = local_a8 + GA_total_memory;
    }
    pnga_destroy((Integer)in_stack_fffffffffffffaa8);
    local_c8 = 0;
  }
  else {
    GAstat.curmem = GA[local_50].size + GAstat.curmem;
    lVar8 = GAstat.curmem;
    if (GAstat.curmem <= GAstat.maxmem) {
      lVar8 = GAstat.maxmem;
    }
    GAstat.maxmem = lVar8;
    local_c8 = 1;
  }
  return local_c8;
}

Assistant:

logical pnga_allocate(Integer g_a)
{

  Integer hi[MAXDIM];
  Integer ga_handle = g_a + GA_OFFSET;
  Integer d, width[MAXDIM], ndim;
  Integer mem_size, nelem, pnum;
  Integer i, status, maplen=0, p_handle;
  Integer dims[MAXDIM], chunk[MAXDIM];
  Integer pe[MAXDIM], *pmap[MAXDIM], *map;
  Integer blk[MAXDIM];
  Integer grp_me=GAme, grp_nproc=GAnproc;
  Integer block_size = 0;

  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous sync masking*/
  if (GA[ga_handle].ndim == -1)
    pnga_error("Insufficient data to create global array",0);

  p_handle = (Integer)GA[ga_handle].p_handle;
  if (p_handle == (Integer)GA_Init_Proc_Group) {
    GA[ga_handle].p_handle = GA_Default_Proc_Group;
    p_handle = GA_Default_Proc_Group;
  }
  pnga_pgroup_sync(p_handle);

  if (p_handle > 0) {
     grp_nproc  = PGRP_LIST[p_handle].map_nproc;
     grp_me = PGRP_LIST[p_handle].map_proc_list[GAme];
  }
  
  if(!GAinitialized) pnga_error("GA not initialized ", 0);
  if(!ma_address_init) gai_ma_address_init();

  ndim = GA[ga_handle].ndim;
  for (i=0; i<ndim; i++) width[i] = (C_Integer)GA[ga_handle].width[i];

  /* The data distribution has not been specified by the user. Create
     default distribution */
  if (GA[ga_handle].mapc == NULL && GA[ga_handle].distr_type == REGULAR) {
    for (d=0; d<ndim; d++) {
      dims[d] = (Integer)GA[ga_handle].dims[d];
      chunk[d] = (Integer)GA[ga_handle].chunk[d];
    }
    if(chunk[0]!=0) /* for chunk[0]=0 compute all */
      for(d=0; d< ndim; d++) blk[d]=(Integer)GA_MIN(chunk[d],dims[d]);
    else
      for(d=0; d< ndim; d++) blk[d]=-1;

    /* eliminate dimensions =1 from ddb analysis */
    for(d=0; d<ndim; d++)if(dims[d]==1)blk[d]=1;
 
    if (GAme==0 && DEBUG )
      for (d=0;d<ndim;d++) fprintf(stderr,"b[%ld]=%ld\n",(long)d,(long)blk[d]);
    pnga_pgroup_sync(p_handle);

    /* ddb(ndim, dims, GAnproc, blk, pe);*/
    if(p_handle == 0) /* for mirrored arrays */
#if OLD_DISTRIBUTION
       ddb_h2(ndim, dims, PGRP_LIST[p_handle].map_nproc,0.0,(Integer)0, blk, pe);
#else
       ddb(ndim, dims, PGRP_LIST[p_handle].map_nproc, blk, pe);
#endif
    else
       if (GA[ga_handle].num_rstrctd == 0) {
         /* Data is normally distributed on processors */
#if OLD_DISTRIBUTION
         ddb_h2(ndim, dims, grp_nproc,0.0,(Integer)0, blk, pe);
#else
         ddb(ndim, dims, grp_nproc, blk, pe);
#endif
       } else {
         /* Data is only distributed on subset of processors */
#if OLD_DISTRIBUTION
         ddb_h2(ndim, dims, GA[ga_handle].num_rstrctd, 0.0, (Integer)0, blk, pe);
#else
         ddb(ndim, dims, GA[ga_handle].num_rstrctd, blk, pe);
#endif
       }

    for(d=0, map=mapALL; d< ndim; d++){
      Integer nblock;
      Integer pcut; /* # procs that get full blk[] elements; the rest gets less*/
      int p;

      pmap[d] = map;

      /* RJH ... don't leave some nodes without data if possible
       but respect the users block size */
      
      if (chunk[d] > 1) {
        Integer ddim = ((dims[d]-1)/GA_MIN(chunk[d],dims[d]) + 1);
        pcut = (ddim -(blk[d]-1)*pe[d]) ;
      }
      else {
        pcut = (dims[d]-(blk[d]-1)*pe[d]) ;
      }

      for (nblock=i=p=0; (p<pe[d]) && (i<dims[d]); p++, nblock++) {
        Integer b = blk[d];
        if (p >= pcut)
          b = b-1;
        map[nblock] = i+1;
        if (chunk[d]>1) b *= GA_MIN(chunk[d],dims[d]);
        i += b;
      }

      pe[d] = GA_MIN(pe[d],nblock);
      map +=  pe[d]; 
    }
    if(GAme==0&& DEBUG){
      gai_print_subscript("pe ",(int)ndim, pe,"\n");
      gai_print_subscript("blocks ",(int)ndim, blk,"\n");
      printf("decomposition map\n");
      for(d=0; d< ndim; d++){
        printf("dim=%ld: ",(long)d); 
        for (i=0;i<pe[d];i++)printf("%ld ",(long)pmap[d][i]);
        printf("\n"); 
      }
      fflush(stdout);
    }
    maplen = 0;
    for( i = 0; i< ndim; i++){
      GA[ga_handle].nblock[i] = pe[i];
      maplen += pe[i];
    }
    GA[ga_handle].mapc = (C_Integer*)malloc((maplen+1)*sizeof(C_Integer*));
    for(i = 0; i< maplen; i++) {
      GA[ga_handle].mapc[i] = (C_Integer)mapALL[i];
    }
    GA[ga_handle].mapc[maplen] = -1;
  } else if (GA[ga_handle].distr_type == BLOCK_CYCLIC) {
    /* Regular block-cyclic data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer nblocks = GA[ga_handle].block_total;
    Integer tsize, j;
    Integer lo[MAXDIM];
    block_size = 0;
    for (i=GAme; i<nblocks; i +=GAnproc) {
      ga_ownsM(ga_handle,i,lo,hi);
      tsize = 1;
      for (j=0; j<ndim; j++) {
        tsize *= (hi[j] - lo[j] + 1);
      }
      block_size += tsize;
    }
  } else if (GA[ga_handle].distr_type == SCALAPACK) {
    /* ScaLAPACK block-cyclic data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer j, jtot, skip, imin, imax, tot;
    Integer index[MAXDIM];
    gam_find_proc_indices(ga_handle,GAme,index);
    block_size = 1;
    tot = 1;
    for (i=0; i<GA[ga_handle].ndim; i++) {
      tot *= GA[ga_handle].nblock[i];
    }
    if (GA[ga_handle].num_rstrctd == 0) {
      pnum = pnga_pgroup_nnodes(GA[ga_handle].p_handle);
    } else {
      pnum = GA[ga_handle].num_rstrctd;
    }
    if (tot != pnum)
      pnga_error("Number of processors in processor grid must equal available processors",0);
    for (i=0; i<ndim; i++) {
      skip = GA[ga_handle].nblock[i];
      jtot = 0;
      for (j=index[i]; j<GA[ga_handle].num_blocks[i]; j += skip) {
        imin = j*GA[ga_handle].block_dims[i] + 1;
        imax = (j+1)*GA[ga_handle].block_dims[i];
        if (imax > GA[ga_handle].dims[i]) imax = GA[ga_handle].dims[i];
        jtot += (imax-imin+1);
      }
      block_size *= jtot;
    }
  } else if (GA[ga_handle].distr_type == TILED) {
    /* Tiled data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer j, jtot, skip, imin, imax, tot;
    Integer index[MAXDIM];
    gam_find_tile_proc_indices(ga_handle,GAme,index);
    block_size = 1;
    tot = 1;
    for (i=0; i<GA[ga_handle].ndim; i++) {
      tot *= GA[ga_handle].nblock[i];
    }
    if (GA[ga_handle].num_rstrctd == 0) {
      pnum = pnga_pgroup_nnodes(GA[ga_handle].p_handle);
    } else {
      pnum = GA[ga_handle].num_rstrctd;
    }
    if (tot != pnum)
      pnga_error("Number of processors in processor grid must equal available processors",0);
    for (i=0; i<ndim; i++) {
      skip = GA[ga_handle].nblock[i];
      jtot = 0;
      for (j=index[i]; j<GA[ga_handle].num_blocks[i]; j += skip) {
        imin = j*GA[ga_handle].block_dims[i] + 1;
        imax = (j+1)*GA[ga_handle].block_dims[i];
        if (imax > GA[ga_handle].dims[i]) imax = GA[ga_handle].dims[i];
        jtot += (imax-imin+1);
      }
      block_size *= jtot;
    }
  } else if (GA[ga_handle].distr_type == TILED_IRREG) {
    /* Tiled data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer j, jtot, skip, imin, imax, tot;
    Integer index[MAXDIM];
    Integer offset = 0;
    gam_find_tile_proc_indices(ga_handle,GAme,index);
    block_size = 1;
    tot = 1;
    for (i=0; i<GA[ga_handle].ndim; i++) {
      tot *= GA[ga_handle].nblock[i];
    }
    if (GA[ga_handle].num_rstrctd == 0) {
      pnum = pnga_pgroup_nnodes(GA[ga_handle].p_handle);
    } else {
      pnum = GA[ga_handle].num_rstrctd;
    }
    if (tot != pnum)
      pnga_error("Number of processors in processor grid must equal available processors",0);
    for (i=0; i<ndim; i++) {
      skip = GA[ga_handle].nblock[i];
      jtot = 0;
      for (j=index[i]; j<GA[ga_handle].num_blocks[i]; j += skip) {
        imin = GA[ga_handle].mapc[offset+j];
        if (j<GA[ga_handle].num_blocks[i]-1) {
          imax = GA[ga_handle].mapc[offset+j+1]-1;
        } else {
          imax = GA[ga_handle].dims[i];
        }
        jtot += (imax-imin+1);
      }
      block_size *= jtot;
      offset += GA[ga_handle].num_blocks[i];
    }
  }

  GAstat.numcre ++;

  GA[ga_handle].actv = 1;
  /* If only one node is being used and array is mirrored,
   * set proc list to world group */
  if (pnga_cluster_nnodes() == 1 && GA[ga_handle].p_handle == 0) {
    GA[ga_handle].p_handle = pnga_pgroup_get_world();
  }

  /* Set remaining parameters and determine memory size if regular data
   * distribution is being used */
  if (GA[ga_handle].distr_type == REGULAR) {
    /* set corner flag, if it has not already been set and set up message
       passing data */
    if (GA[ga_handle].corner_flag == -1) {
       i = 1;
    } else {
       i = GA[ga_handle].corner_flag;
    }
    for( i = 0; i< ndim; i++){
       GA[ga_handle].scale[i] = (double)GA[ga_handle].nblock[i]
         / (double)GA[ga_handle].dims[i];
    }
    pnga_set_ghost_corner_flag(g_a, i);
 
    /*** determine which portion of the array I am supposed to hold ***/
    if (p_handle == 0) { /* for mirrored arrays */
       Integer me_local = (Integer)PGRP_LIST[p_handle].map_proc_list[GAme];
       pnga_distribution(g_a, me_local, GA[ga_handle].lo, hi);
    } else {
       pnga_distribution(g_a, grp_me, GA[ga_handle].lo, hi);
    }
    if (GA[ga_handle].num_rstrctd == 0 || GA[ga_handle].has_data == 1) {
      for( i = 0, nelem=1; i< ndim; i++){
        /*
        GA[ga_handle].chunk[i] = ((C_Integer)hi[i]-GA[ga_handle].lo[i]+1);
        */
        nelem *= (hi[i]-(Integer)GA[ga_handle].lo[i]+1+2*width[i]);
      }
    } else {
      nelem = 0;
    }
    mem_size = nelem * GA[ga_handle].elemsize;
  } else {
    mem_size = block_size * GA[ga_handle].elemsize;
    for( i = 0; i< ndim; i++){
       GA[ga_handle].scale[i] = (double)GA[ga_handle].num_blocks[i]
         / (double)GA[ga_handle].dims[i];
    }
  }
  GA[ga_handle].id = INVALID_MA_HANDLE;
  GA[ga_handle].size = (C_Long)mem_size;
  /* if requested, enforce limits on memory consumption */
  if(GA_memory_limited) GA_total_memory -= mem_size;
  /* check if everybody has enough memory left */
  if(GA_memory_limited){
     status = (GA_total_memory >= 0) ? 1 : 0;
     if (p_handle > 0) {
        /* pnga_pgroup_gop(p_handle,pnga_type_f2c(MT_F_INT), &status, 1, "*"); */
        pnga_pgroup_gop(p_handle,pnga_type_f2c(MT_F_INT), &status, 1, "&&");
     } else {
        /* pnga_gop(pnga_type_f2c(MT_F_INT), &status, 1, "*"); */
        pnga_gop(pnga_type_f2c(MT_F_INT), &status, 1, "&&");
     }
  }else status = 1;

  if (status) {
    if (GA[ga_handle].mem_dev_set) {
      status = !gai_get_devmem(GA[ga_handle].name, GA[ga_handle].ptr,mem_size,
          GA[ga_handle].type, &GA[ga_handle].id, p_handle,
          GA[ga_handle].mem_dev_set, GA[ga_handle].mem_dev);
    } else {
      status = !gai_getmem(GA[ga_handle].name, GA[ga_handle].ptr,mem_size,
          GA[ga_handle].type, &GA[ga_handle].id, p_handle);
    }
  } else {
     GA[ga_handle].ptr[grp_me]=NULL;
  }

  if (GA[ga_handle].distr_type == REGULAR) {
    /* Finish setting up information for ghost cell updates */
    if (GA[ga_handle].ghosts == 1) {
      if (!pnga_set_ghost_info(g_a))
        pnga_error("Could not allocate update information for ghost cells",0);
    }
    /* If array is mirrored, evaluate first and last indices */
    /* ngai_get_first_last_indices(&g_a); */
  }

  pnga_pgroup_sync(p_handle);
  if (status) {
    GAstat.curmem += (long)GA[ga_handle].size;
    GAstat.maxmem  = (long)GA_MAX(GAstat.maxmem, GAstat.curmem);
    status = TRUE;
  } else {
    if(GA_memory_limited) GA_total_memory += mem_size;
    pnga_destroy(g_a);
    status = FALSE;
  }
  return status;
}